

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2NullVsEmptyStringSubmatches(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  StringPiece *local_1d50;
  LogMessage local_1d30;
  StringPiece local_1bb0;
  LogMessage local_1ba0;
  LogMessage local_1a20;
  StringPiece local_18a0;
  LogMessage local_1890;
  StringPiece local_1710;
  LogMessage local_1700;
  LogMessage local_1580;
  StringPiece local_1400;
  LogMessage local_13f0;
  StringPiece local_1270;
  LogMessage local_1260;
  LogMessage local_10e0;
  StringPiece local_f60;
  LogMessage local_f50;
  StringPiece local_dd0;
  LogMessage local_dc0;
  LogMessage local_c40;
  StringPiece local_ac0;
  LogMessage local_ab0;
  undefined1 local_930 [8];
  StringPiece empty;
  undefined4 local_918;
  int local_90c;
  undefined1 local_908 [4];
  int i_2;
  StringPiece local_788;
  LogMessage local_778;
  LogMessage local_5f8;
  StringPiece local_478;
  int local_464;
  undefined1 local_460 [4];
  int i_1;
  undefined1 local_2e0 [8];
  StringPiece null;
  undefined4 local_2c8;
  int local_2bc;
  undefined1 local_2b8 [4];
  int i;
  StringPiece matches [4];
  undefined1 local_e8 [8];
  RE2 re;
  
  RE2::RE2((RE2 *)local_e8,"()|(foo)");
  bVar1 = RE2::ok((RE2 *)local_e8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&matches[3].length_,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x597);
    poVar3 = LogMessage::stream((LogMessage *)&matches[3].length_);
    std::operator<<(poVar3,"Check failed: re.ok()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&matches[3].length_);
  }
  local_1d50 = (StringPiece *)local_2b8;
  do {
    StringPiece::StringPiece(local_1d50);
    local_1d50 = local_1d50 + 1;
  } while (local_1d50 != (StringPiece *)&matches[3].length_);
  for (local_2bc = 0; local_2bc < 4; local_2bc = local_2bc + 1) {
    StringPiece::StringPiece((StringPiece *)&null.length_,"bar");
    *(undefined8 *)(local_2b8 + (long)local_2bc * 0x10) = null._8_8_;
    *(undefined4 *)&matches[local_2bc].ptr_ = local_2c8;
  }
  StringPiece::StringPiece((StringPiece *)local_2e0);
  iVar2 = StringPiece::size((StringPiece *)local_2e0);
  bVar1 = RE2::Match((RE2 *)local_e8,(StringPiece *)local_2e0,0,iVar2,UNANCHORED,
                     (StringPiece *)local_2b8,4);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_460,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5a1);
    poVar3 = LogMessage::stream((LogMessage *)local_460);
    std::operator<<(poVar3,
                    "Check failed: re.Match(null, 0, null.size(), RE2::UNANCHORED, matches, arraysize(matches))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_460);
  }
  for (local_464 = 0; local_464 < 4; local_464 = local_464 + 1) {
    lVar4 = (long)local_464;
    StringPiece::StringPiece(&local_478,(char *)0x0);
    bVar1 = operator==((StringPiece *)(local_2b8 + lVar4 * 0x10),&local_478);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_5f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x5a3);
      poVar3 = LogMessage::stream(&local_5f8);
      std::operator<<(poVar3,"Check failed: matches[i] == NULL");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_5f8);
    }
    pcVar5 = StringPiece::data((StringPiece *)(local_2b8 + (long)local_464 * 0x10));
    if (pcVar5 != (char *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_778,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x5a4);
      poVar3 = LogMessage::stream(&local_778);
      std::operator<<(poVar3,"Check failed: matches[i].data() == NULL");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_778);
    }
    lVar4 = (long)local_464;
    StringPiece::StringPiece(&local_788,"");
    bVar1 = operator==((StringPiece *)(local_2b8 + lVar4 * 0x10),&local_788);
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_908,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0x5a5);
      poVar3 = LogMessage::stream((LogMessage *)local_908);
      std::operator<<(poVar3,"Check failed: matches[i] == \"\"");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_908);
    }
  }
  for (local_90c = 0; local_90c < 4; local_90c = local_90c + 1) {
    StringPiece::StringPiece((StringPiece *)&empty.length_,"bar");
    *(undefined8 *)(local_2b8 + (long)local_90c * 0x10) = empty._8_8_;
    *(undefined4 *)&matches[local_90c].ptr_ = local_918;
  }
  StringPiece::StringPiece((StringPiece *)local_930,"");
  iVar2 = StringPiece::size((StringPiece *)local_930);
  bVar1 = RE2::Match((RE2 *)local_e8,(StringPiece *)local_930,0,iVar2,UNANCHORED,
                     (StringPiece *)local_2b8,4);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_ab0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5ad);
    poVar3 = LogMessage::stream(&local_ab0);
    std::operator<<(poVar3,
                    "Check failed: re.Match(empty, 0, empty.size(), RE2::UNANCHORED, matches, arraysize(matches))"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_ab0);
  }
  StringPiece::StringPiece(&local_ac0,(char *)0x0);
  bVar1 = operator==((StringPiece *)local_2b8,&local_ac0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c40,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5ae);
    poVar3 = LogMessage::stream(&local_c40);
    std::operator<<(poVar3,"Check failed: matches[0] == NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c40);
  }
  pcVar5 = StringPiece::data((StringPiece *)local_2b8);
  if (pcVar5 == (char *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_dc0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5af);
    poVar3 = LogMessage::stream(&local_dc0);
    std::operator<<(poVar3,"Check failed: matches[0].data() != NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_dc0);
  }
  StringPiece::StringPiece(&local_dd0,"");
  bVar1 = operator==((StringPiece *)local_2b8,&local_dd0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_f50,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b0);
    poVar3 = LogMessage::stream(&local_f50);
    std::operator<<(poVar3,"Check failed: matches[0] == \"\"");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_f50);
  }
  StringPiece::StringPiece(&local_f60,(char *)0x0);
  bVar1 = operator==((StringPiece *)&matches[0].length_,&local_f60);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_10e0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b1);
    poVar3 = LogMessage::stream(&local_10e0);
    std::operator<<(poVar3,"Check failed: matches[1] == NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_10e0);
  }
  pcVar5 = StringPiece::data((StringPiece *)&matches[0].length_);
  if (pcVar5 == (char *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1260,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b2);
    poVar3 = LogMessage::stream(&local_1260);
    std::operator<<(poVar3,"Check failed: matches[1].data() != NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1260);
  }
  StringPiece::StringPiece(&local_1270,"");
  bVar1 = operator==((StringPiece *)&matches[0].length_,&local_1270);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_13f0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b3);
    poVar3 = LogMessage::stream(&local_13f0);
    std::operator<<(poVar3,"Check failed: matches[1] == \"\"");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_13f0);
  }
  StringPiece::StringPiece(&local_1400,(char *)0x0);
  bVar1 = operator==((StringPiece *)&matches[1].length_,&local_1400);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1580,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b4);
    poVar3 = LogMessage::stream(&local_1580);
    std::operator<<(poVar3,"Check failed: matches[2] == NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1580);
  }
  pcVar5 = StringPiece::data((StringPiece *)&matches[1].length_);
  if (pcVar5 != (char *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1700,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b5);
    poVar3 = LogMessage::stream(&local_1700);
    std::operator<<(poVar3,"Check failed: matches[2].data() == NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1700);
  }
  StringPiece::StringPiece(&local_1710,"");
  bVar1 = operator==((StringPiece *)&matches[1].length_,&local_1710);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1890,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b6);
    poVar3 = LogMessage::stream(&local_1890);
    std::operator<<(poVar3,"Check failed: matches[2] == \"\"");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1890);
  }
  StringPiece::StringPiece(&local_18a0,(char *)0x0);
  bVar1 = operator==((StringPiece *)&matches[2].length_,&local_18a0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a20,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b7);
    poVar3 = LogMessage::stream(&local_1a20);
    std::operator<<(poVar3,"Check failed: matches[3] == NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a20);
  }
  pcVar5 = StringPiece::data((StringPiece *)&matches[2].length_);
  if (pcVar5 != (char *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1ba0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b8);
    poVar3 = LogMessage::stream(&local_1ba0);
    std::operator<<(poVar3,"Check failed: matches[3].data() == NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1ba0);
  }
  StringPiece::StringPiece(&local_1bb0,"");
  bVar1 = operator==((StringPiece *)&matches[2].length_,&local_1bb0);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1d30,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x5b9);
    poVar3 = LogMessage::stream(&local_1d30);
    std::operator<<(poVar3,"Check failed: matches[3] == \"\"");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1d30);
  }
  RE2::~RE2((RE2 *)local_e8);
  return;
}

Assistant:

TEST(RE2, NullVsEmptyStringSubmatches) {
  RE2 re("()|(foo)");
  EXPECT_TRUE(re.ok());

  // matches[0] is overall match, [1] is (), [2] is (foo), [3] is nonexistent.
  StringPiece matches[4];

  for (int i = 0; i < arraysize(matches); i++)
    matches[i] = "bar";

  StringPiece null;
  EXPECT_TRUE(re.Match(null, 0, null.size(), RE2::UNANCHORED,
                       matches, arraysize(matches)));
  for (int i = 0; i < arraysize(matches); i++) {
    EXPECT_TRUE(matches[i] == NULL);
    EXPECT_TRUE(matches[i].data() == NULL);  // always null
    EXPECT_TRUE(matches[i] == "");
  }

  for (int i = 0; i < arraysize(matches); i++)
    matches[i] = "bar";

  StringPiece empty("");
  EXPECT_TRUE(re.Match(empty, 0, empty.size(), RE2::UNANCHORED,
                       matches, arraysize(matches)));
  EXPECT_TRUE(matches[0] == NULL);
  EXPECT_TRUE(matches[0].data() != NULL);  // empty, not null
  EXPECT_TRUE(matches[0] == "");
  EXPECT_TRUE(matches[1] == NULL);
  EXPECT_TRUE(matches[1].data() != NULL);  // empty, not null
  EXPECT_TRUE(matches[1] == "");
  EXPECT_TRUE(matches[2] == NULL);
  EXPECT_TRUE(matches[2].data() == NULL);
  EXPECT_TRUE(matches[2] == "");
  EXPECT_TRUE(matches[3] == NULL);
  EXPECT_TRUE(matches[3].data() == NULL);
  EXPECT_TRUE(matches[3] == "");
}